

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstantExecution.h
# Opt level: O0

void nrg::InstantExecution::push<void(*)()>(Queue *queue,_func_void *fn)

{
  function<void_()> local_60;
  anon_class_8_1_3fcf6586 local_40;
  undefined1 local_38 [8];
  QueueElement elem;
  _func_void *fn_local;
  Queue *queue_local;
  
  local_40.fn = fn;
  elem._M_invoker = (_Invoker_type)fn;
  std::function<void()>::
  function<nrg::InstantExecution::push<void(*)()>(std::queue<std::function<void()>,std::deque<std::function<void()>,std::allocator<std::function<void()>>>>&,void(*)())::_lambda()_1_,void>
            ((function<void()> *)local_38,&local_40);
  std::function<void_()>::function(&local_60,(function<void_()> *)local_38);
  push(queue,&local_60);
  std::function<void_()>::~function(&local_60);
  std::function<void_()>::~function((function<void_()> *)local_38);
  return;
}

Assistant:

static void push(Queue& queue, FN fn, Param&&... param)
    {
        QueueElement elem = [=]() { fn(param...); };
        push(queue, elem);
    }